

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool slang::ast::checkRangeOverflow<slang::ast::ASTContext_const>
               (ConstantRange range,ASTContext *context,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  uint64_t uVar1;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  ASTContext *in_RSI;
  DiagCode in_EDI;
  
  uVar1 = ConstantRange::fullWidth((ConstantRange *)&stack0xfffffffffffffff4);
  if (0x7fffffff < uVar1) {
    sourceRange_00.endLoc = in_RCX;
    sourceRange_00.startLoc = in_RDX;
    ASTContext::addDiag(in_RSI,in_EDI,sourceRange_00);
  }
  return 0x7fffffff < uVar1;
}

Assistant:

static bool checkRangeOverflow(ConstantRange range, TContext& context, SourceRange sourceRange) {
    if (range.fullWidth() > INT32_MAX) {
        context.addDiag(diag::RangeWidthOverflow, sourceRange);
        return true;
    }
    return false;
}